

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O2

int jsmn_parse(jsmn_parser *parser,char *js,size_t len,jsmntok_t *tokens,size_t num_tokens)

{
  uint uVar1;
  byte bVar2;
  char cVar3;
  jsmntype_t jVar4;
  int iVar5;
  long lVar6;
  jsmntok_t *pjVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  
  uVar14 = parser->pos;
  uVar12 = parser->toknext;
LAB_00161d61:
  uVar11 = 0xfffffffe;
  uVar10 = (ulong)uVar14;
  if (len <= uVar10) {
LAB_001621cd:
    uVar11 = uVar12;
    if (tokens != (jsmntok_t *)0x0) {
      uVar14 = parser->toknext;
      do {
        uVar14 = uVar14 - 1;
        if ((int)uVar14 < 0) {
          return uVar12;
        }
      } while ((tokens[uVar14 & 0x7fffffff].start == -1) ||
              (uVar11 = 0xfffffffd, tokens[uVar14 & 0x7fffffff].end != -1));
    }
switchD_00161d87_caseD_21:
    return uVar11;
  }
  bVar2 = js[uVar10];
  uVar13 = uVar14;
  switch(bVar2) {
  case 0x20:
    break;
  case 0x21:
  case 0x23:
  case 0x24:
  case 0x25:
  case 0x26:
  case 0x27:
  case 0x28:
  case 0x29:
  case 0x2a:
  case 0x2b:
  case 0x2e:
  case 0x2f:
    goto switchD_00161d87_caseD_21;
  case 0x22:
    uVar13 = uVar14 + 1;
    do {
      parser->pos = uVar13;
      if (len <= uVar13) goto LAB_001621a7;
      cVar3 = js[uVar13];
      uVar9 = uVar13;
      if (cVar3 == '\\') {
        uVar1 = uVar13 + 1;
        if (uVar1 < len) {
          parser->pos = uVar1;
          bVar2 = js[uVar1];
          uVar9 = uVar1;
          if ((0x37 < bVar2 - 0x2f) ||
             ((0x88200000000001U >> ((ulong)(bVar2 - 0x2f) & 0x3f) & 1) == 0)) {
            switch(bVar2) {
            case 0x6e:
            case 0x72:
            case 0x74:
              break;
            case 0x6f:
            case 0x70:
            case 0x71:
            case 0x73:
              goto switchD_00161ded_caseD_6f;
            case 0x75:
              parser->pos = uVar13 + 2;
              uVar9 = uVar13 + 3;
              iVar5 = 0;
              while (((iVar5 != -4 && (uVar9 - 1 < len)) && (bVar2 = js[uVar9 - 1], bVar2 != 0))) {
                if ((9 < (byte)(bVar2 - 0x30)) &&
                   ((0x25 < bVar2 - 0x41 ||
                    ((0x3f0000003fU >> ((ulong)(bVar2 - 0x41) & 0x3f) & 1) == 0))))
                goto switchD_00161ded_caseD_6f;
                parser->pos = uVar9;
                iVar5 = iVar5 + -1;
                uVar9 = uVar9 + 1;
              }
              uVar9 = (uVar13 - iVar5) + 1;
              parser->pos = uVar9;
              break;
            default:
              if (bVar2 != 0x22) goto switchD_00161ded_caseD_6f;
            }
          }
        }
      }
      else {
        if (cVar3 == '\0') goto LAB_001621a7;
        if (cVar3 == '\"') goto LAB_00162119;
      }
      uVar13 = uVar9 + 1;
    } while( true );
  case 0x2c:
    if (((tokens != (jsmntok_t *)0x0) && (lVar6 = (long)parser->toksuper, lVar6 != -1)) &&
       (1 < tokens[lVar6].type - JSMN_OBJECT)) {
      iVar5 = tokens[lVar6].parent;
      goto LAB_0016210b;
    }
    break;
  case 0x2d:
  case 0x30:
  case 0x31:
  case 0x32:
  case 0x33:
  case 0x34:
  case 0x35:
  case 0x36:
  case 0x37:
  case 0x38:
  case 0x39:
switchD_00161d87_caseD_2d:
    if ((tokens != (jsmntok_t *)0x0) && (lVar6 = (long)parser->toksuper, lVar6 != -1)) {
      if (tokens[lVar6].type == JSMN_STRING) {
        if (tokens[lVar6].size != 0) {
          return -2;
        }
      }
      else if (tokens[lVar6].type == JSMN_OBJECT) {
        return -2;
      }
    }
    do {
      uVar13 = (uint)uVar10;
      if (len <= uVar10) goto LAB_001621a7;
      bVar2 = js[uVar10];
      uVar10 = (ulong)bVar2;
      if (uVar10 < 0x2d) {
        if ((0x100100002600U >> (uVar10 & 0x3f) & 1) != 0) goto LAB_00161fa7;
        if (uVar10 == 0) goto LAB_001621a7;
      }
      if ((bVar2 == 0x5d) || (bVar2 == 0x7d)) goto LAB_00161fa7;
      if ((byte)(bVar2 + 0x81) < 0xa1) goto switchD_00161ded_caseD_6f;
      uVar10 = (ulong)(uVar13 + 1);
      parser->pos = uVar13 + 1;
    } while( true );
  case 0x3a:
    iVar5 = parser->toknext - 1;
LAB_0016210b:
    parser->toksuper = iVar5;
    break;
  default:
    uVar8 = (ulong)(bVar2 - 0x5b);
    if (bVar2 - 0x5b < 0x23) {
      if ((0x2080800UL >> (uVar8 & 0x3f) & 1) != 0) goto switchD_00161d87_caseD_2d;
      if ((0x100000001U >> (uVar8 & 0x3f) & 1) == 0) {
        if ((0x400000004U >> (uVar8 & 0x3f) & 1) == 0) goto LAB_00161f3e;
        if (tokens != (jsmntok_t *)0x0) {
          if (parser->toknext == 0) {
            return -2;
          }
          jVar4 = (bVar2 != 0x7d) + JSMN_OBJECT;
          uVar10 = (ulong)(parser->toknext - 1);
          do {
            pjVar7 = tokens + uVar10;
            if ((tokens[uVar10].start != -1) && (pjVar7->end == -1)) {
              if (pjVar7->type != jVar4) {
                return -2;
              }
              pjVar7->end = uVar14 + 1;
              iVar5 = pjVar7->parent;
              goto LAB_0016210b;
            }
            uVar10 = (ulong)pjVar7->parent;
          } while (uVar10 != 0xffffffffffffffff);
          if (pjVar7->type != jVar4) {
            return -2;
          }
          if (parser->toksuper == -1) {
            return -2;
          }
        }
      }
      else {
        uVar12 = uVar12 + 1;
        if (tokens != (jsmntok_t *)0x0) {
          pjVar7 = jsmn_alloc_token(parser,tokens,num_tokens);
          if (pjVar7 == (jsmntok_t *)0x0) {
            return -1;
          }
          iVar5 = parser->toksuper;
          if ((long)iVar5 != -1) {
            tokens[iVar5].size = tokens[iVar5].size + 1;
            pjVar7->parent = iVar5;
          }
          pjVar7->type = (bVar2 != 0x7b) + JSMN_OBJECT;
          uVar13 = parser->pos;
          pjVar7->start = uVar13;
          parser->toksuper = parser->toknext - 1;
        }
      }
    }
    else {
LAB_00161f3e:
      if ((1 < bVar2 - 9) && (bVar2 != 0xd)) {
        if (bVar2 != 0) {
          return -2;
        }
        goto LAB_001621cd;
      }
    }
  }
switchD_00161d87_caseD_20:
  uVar14 = uVar13 + 1;
  parser->pos = uVar14;
  goto LAB_00161d61;
LAB_00161fa7:
  if (tokens == (jsmntok_t *)0x0) {
    iVar5 = parser->toksuper;
  }
  else {
    pjVar7 = jsmn_alloc_token(parser,tokens,num_tokens);
    if (pjVar7 == (jsmntok_t *)0x0) {
      uVar11 = 0xffffffff;
      goto switchD_00161ded_caseD_6f;
    }
    uVar13 = parser->pos;
    pjVar7->type = JSMN_PRIMITIVE;
    pjVar7->start = uVar14;
    pjVar7->end = uVar13;
    pjVar7->size = 0;
    iVar5 = parser->toksuper;
    pjVar7->parent = iVar5;
  }
  uVar13 = uVar13 - 1;
  parser->pos = uVar13;
  uVar12 = uVar12 + 1;
  if (iVar5 != -1 && tokens != (jsmntok_t *)0x0) {
    tokens[iVar5].size = tokens[iVar5].size + 1;
  }
  goto switchD_00161d87_caseD_20;
LAB_00162119:
  if (tokens == (jsmntok_t *)0x0) {
    uVar12 = uVar12 + 1;
  }
  else {
    pjVar7 = jsmn_alloc_token(parser,tokens,num_tokens);
    if (pjVar7 == (jsmntok_t *)0x0) {
      uVar11 = 0xffffffff;
      goto switchD_00161ded_caseD_6f;
    }
    uVar13 = parser->pos;
    pjVar7->type = JSMN_STRING;
    pjVar7->start = uVar14 + 1;
    pjVar7->end = uVar13;
    pjVar7->size = 0;
    iVar5 = parser->toksuper;
    pjVar7->parent = iVar5;
    uVar12 = uVar12 + 1;
    if ((long)iVar5 != -1 && tokens != (jsmntok_t *)0x0) {
      tokens[iVar5].size = tokens[iVar5].size + 1;
    }
  }
  goto switchD_00161d87_caseD_20;
LAB_001621a7:
  uVar11 = 0xfffffffd;
switchD_00161ded_caseD_6f:
  parser->pos = uVar14;
  return uVar11;
}

Assistant:

static int jsmn_parse(jsmn_parser *parser, const char *js, size_t len,
                      jsmntok_t *tokens, size_t num_tokens) {
    int r;
    int i;
    jsmntok_t *token;
    int count = parser->toknext;

    for (; parser->pos < len && js[parser->pos] != '\0'; parser->pos++) {
        char c;
        jsmntype_t type;

        c = js[parser->pos];
        switch (c) {
            case '{': case '[':
                count++;
                if (tokens == NULL) {
                    break;
                }
                token = jsmn_alloc_token(parser, tokens, num_tokens);
                if (token == NULL)
                    return JSMN_ERROR_NOMEM;
                if (parser->toksuper != -1) {
                    tokens[parser->toksuper].size++;
#ifdef JSMN_PARENT_LINKS
                    token->parent = parser->toksuper;
#endif
                }
                token->type = (c == '{' ? JSMN_OBJECT : JSMN_ARRAY);
                token->start = parser->pos;
                parser->toksuper = parser->toknext - 1;
                break;
            case '}': case ']':
                if (tokens == NULL)
                    break;
                type = (c == '}' ? JSMN_OBJECT : JSMN_ARRAY);
#ifdef JSMN_PARENT_LINKS
                if (parser->toknext < 1) {
                    return JSMN_ERROR_INVAL;
                }
                token = &tokens[parser->toknext - 1];
                for (;;) {
                    if (token->start != -1 && token->end == -1) {
                        if (token->type != type) {
                            return JSMN_ERROR_INVAL;
                        }
                        token->end = parser->pos + 1;
                        parser->toksuper = token->parent;
                        break;
                    }
                    if (token->parent == -1) {
                        if(token->type != type || parser->toksuper == -1) {
                            return JSMN_ERROR_INVAL;
                        }
                        break;
                    }
                    token = &tokens[token->parent];
                }
#else
                for (i = parser->toknext - 1; i >= 0; i--) {
				token = &tokens[i];
				if (token->start != -1 && token->end == -1) {
					if (token->type != type) {
						return JSMN_ERROR_INVAL;
					}
					parser->toksuper = -1;
					token->end = parser->pos + 1;
					break;
				}
			}
			/* Error if unmatched closing bracket */
			if (i == -1) return JSMN_ERROR_INVAL;
			for (; i >= 0; i--) {
				token = &tokens[i];
				if (token->start != -1 && token->end == -1) {
					parser->toksuper = i;
					break;
				}
			}
#endif
                break;
            case '\"':
                r = jsmn_parse_string(parser, js, len, tokens, num_tokens);
                if (r < 0) return r;
                count++;
                if (parser->toksuper != -1 && tokens != NULL)
                    tokens[parser->toksuper].size++;
                break;
            case '\t' : case '\r' : case '\n' : case ' ':
                break;
            case ':':
                parser->toksuper = parser->toknext - 1;
                break;
            case ',':
                if (tokens != NULL && parser->toksuper != -1 &&
                    tokens[parser->toksuper].type != JSMN_ARRAY &&
                    tokens[parser->toksuper].type != JSMN_OBJECT) {
#ifdef JSMN_PARENT_LINKS
                    parser->toksuper = tokens[parser->toksuper].parent;
#else
                    for (i = parser->toknext - 1; i >= 0; i--) {
					if (tokens[i].type == JSMN_ARRAY || tokens[i].type == JSMN_OBJECT) {
						if (tokens[i].start != -1 && tokens[i].end == -1) {
							parser->toksuper = i;
							break;
						}
					}
				}
#endif
                }
                break;
#ifdef JSMN_STRICT
                /* In strict mode primitives are: numbers and booleans */
            case '-': case '0': case '1' : case '2': case '3' : case '4':
            case '5': case '6': case '7' : case '8': case '9':
            case 't': case 'f': case 'n' :
                /* And they must not be keys of the object */
                if (tokens != NULL && parser->toksuper != -1) {
                    jsmntok_t *t = &tokens[parser->toksuper];
                    if (t->type == JSMN_OBJECT ||
                        (t->type == JSMN_STRING && t->size != 0)) {
                        return JSMN_ERROR_INVAL;
                    }
                }
#else
                /* In non-strict mode every unquoted value is a primitive */
		default:
#endif
                r = jsmn_parse_primitive(parser, js, len, tokens, num_tokens);
                if (r < 0) return r;
                count++;
                if (parser->toksuper != -1 && tokens != NULL)
                    tokens[parser->toksuper].size++;
                break;

#ifdef JSMN_STRICT
                /* Unexpected char in strict mode */
            default:
                return JSMN_ERROR_INVAL;
#endif
        }
    }

    if (tokens != NULL) {
        for (i = parser->toknext - 1; i >= 0; i--) {
            /* Unmatched opened object or array */
            if (tokens[i].start != -1 && tokens[i].end == -1) {
                return JSMN_ERROR_PART;
            }
        }
    }

    return count;
}